

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O0

void __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::Build
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this)

{
  bool bVar1;
  memory_order mVar2;
  MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *pMVar3;
  pointer ppVar4;
  vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
  *in_RDI;
  idx_t run_idx;
  idx_t level_idx;
  memory_order __b;
  idx_t in_stack_000005d0;
  idx_t in_stack_000005d8;
  MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *in_stack_000005e0;
  pointer ppVar5;
  pointer run_idx_00;
  int iVar6;
  MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this_00;
  
  while( true ) {
    pMVar3 = (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *)
             (in_RDI + 3);
    iVar6 = 5;
    this_00 = pMVar3;
    mVar2 = ::std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (iVar6 - 1U < 2) {
      ppVar5 = (((_Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  *)&pMVar3->tree)->_M_impl).super__Vector_impl_data._M_start;
    }
    else if (iVar6 == 5) {
      ppVar5 = (((_Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  *)&pMVar3->tree)->_M_impl).super__Vector_impl_data._M_start;
    }
    else {
      ppVar5 = (((_Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  *)&pMVar3->tree)->_M_impl).super__Vector_impl_data._M_start;
    }
    run_idx_00 = ppVar5;
    ppVar4 = (pointer)::std::
                      vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                      ::size(in_RDI);
    if (ppVar4 <= ppVar5) break;
    bVar1 = TryNextRun(this_00,(idx_t *)CONCAT44(iVar6,mVar2),(idx_t *)run_idx_00);
    if (bVar1) {
      BuildRun(in_stack_000005e0,in_stack_000005d8,in_stack_000005d0);
    }
    else {
      ::std::this_thread::yield();
    }
  }
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::Build() {
	//	Fan in parent levels until we are at the top
	//	Note that we don't build the top layer as that would just be all the data.
	while (build_level.load() < tree.size()) {
		idx_t level_idx;
		idx_t run_idx;
		if (TryNextRun(level_idx, run_idx)) {
			BuildRun(level_idx, run_idx);
		} else {
			std::this_thread::yield();
		}
	}
}